

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hdecompress.c
# Opt level: O3

int input_nnybble(uchar *infile,int n,uchar *array)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  
  iVar2 = bits_to_go;
  if (n == 1) {
    if (bits_to_go < 4) {
      buffer2 = buffer2 << 8 | (uint)infile[nextchar];
      nextchar = nextchar + 1;
      bits_to_go = bits_to_go + 8;
    }
    iVar2 = bits_to_go + -4;
    bits_to_go = iVar2;
    *array = (byte)(buffer2 >> ((byte)iVar2 & 0x1f)) & 0xf;
    return iVar2;
  }
  if (bits_to_go == 8) {
    nextchar = nextchar + -1;
    bits_to_go = 0;
LAB_00179a68:
    if (n < 2) {
      iVar2 = 0;
LAB_00179ace:
      iVar4 = 0;
      goto LAB_00179ad1;
    }
    lVar3 = 0;
    do {
      bVar1 = infile[lVar3 + nextchar];
      buffer2 = buffer2 << 8 | (uint)bVar1;
      array[lVar3 * 2] = bVar1 >> 4;
      array[lVar3 * 2 + 1] = bVar1 & 0xf;
      lVar3 = lVar3 + 1;
    } while (n / 2 != (int)lVar3);
    nextchar = nextchar + lVar3;
    iVar2 = 0;
  }
  else {
    if (bits_to_go == 0) goto LAB_00179a68;
    if (n < 2) goto LAB_00179ace;
    bVar1 = (byte)bits_to_go;
    lVar3 = 0;
    do {
      buffer2 = (uint)infile[lVar3 + nextchar] | buffer2 << 8;
      array[lVar3 * 2] = (byte)(buffer2 >> (bVar1 + 4 & 0x1f)) & 0xf;
      array[lVar3 * 2 + 1] = (byte)(buffer2 >> (bVar1 & 0x1f)) & 0xf;
      lVar3 = lVar3 + 1;
    } while (n / 2 != (int)lVar3);
    nextchar = nextchar + lVar3;
  }
  iVar4 = (n / 2) * 2;
LAB_00179ad1:
  if (iVar4 != n) {
    if (iVar2 < 4) {
      buffer2 = buffer2 << 8 | (uint)infile[nextchar];
      nextchar = nextchar + 1;
      iVar2 = iVar2 + 8;
    }
    bits_to_go = iVar2 + -4;
    array[(long)n + -1] = (byte)(buffer2 >> ((byte)bits_to_go & 0x1f)) & 0xf;
    iVar2 = n;
  }
  return iVar2;
}

Assistant:

static int input_nnybble(unsigned char *infile, int n, unsigned char array[])
{
	/* copy n 4-bit nybbles from infile to the lower 4 bits of array */

int ii, kk, shift1, shift2;

/*  forcing byte alignment doesn;t help, and even makes it go slightly slower
if (bits_to_go != 8) input_nbits(infile, bits_to_go);
*/
	if (n == 1) {
		array[0] = input_nybble(infile);
		return(0);
	}
	
	if (bits_to_go == 8) {
		/*
		   already have 2 full nybbles in buffer2, so 
		   backspace the infile array to reuse last char
		*/
		nextchar--;
		bits_to_go = 0;
	}
	
	/* bits_to_go now has a value in the range 0 - 7.  After adding  */
	/* another byte, bits_to_go effectively will be in range 8 - 15 */	

	shift1 = bits_to_go + 4;   /* shift1 will be in range 4 - 11 */
	shift2 = bits_to_go;	   /* shift2 will be in range 0 -  7 */
	kk = 0;

	/* special case */
	if (bits_to_go == 0) 
	{
	    for (ii = 0; ii < n/2; ii++) {
		/*
		 * refill the buffer with next byte
		 */
		buffer2 = (buffer2<<8) | (int) infile[nextchar];
		nextchar++;
		array[kk]     = (int) ((buffer2>>4) & 15);
		array[kk + 1] = (int) ((buffer2) & 15);    /* no shift required */
		kk += 2;
	    }
	}
	else
	{
	    for (ii = 0; ii < n/2; ii++) {
		/*
		 * refill the buffer with next byte
		 */
		buffer2 = (buffer2<<8) | (int) infile[nextchar];
		nextchar++;
		array[kk]     = (int) ((buffer2>>shift1) & 15);
		array[kk + 1] = (int) ((buffer2>>shift2) & 15);
		kk += 2;
	    }
	}


	if (ii * 2 != n) {  /* have to read last odd byte */
		array[n-1] = input_nybble(infile);
	}

	return( (buffer2>>bits_to_go) & 15 ); 
}